

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

Action * __thiscall EOPlus::Parser::ParseAction(Action *__return_storage_ptr__,Parser *this)

{
  Expression local_e0;
  undefined1 local_19;
  Parser *local_18;
  Parser *this_local;
  Action *action;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Parser *)__return_storage_ptr__;
  Action::Action(__return_storage_ptr__);
  __return_storage_ptr__->cond = None;
  ParseExpression(&local_e0,this);
  Expression::operator=(&__return_storage_ptr__->expr,&local_e0);
  Expression::~Expression(&local_e0);
  return __return_storage_ptr__;
}

Assistant:

Action Parser::ParseAction()
	{
		Action action;
		action.cond = Action::None;
		action.expr = this->ParseExpression();
		return action;
	}